

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeSetP4KeyInfo(Parse *pParse,Index *pIdx)

{
  Vdbe *p;
  KeyInfo *pP4;
  KeyInfo *pKeyInfo;
  Vdbe *v;
  Index *pIdx_local;
  Parse *pParse_local;
  
  p = pParse->pVdbe;
  pP4 = sqlite3KeyInfoOfIndex(pParse,pIdx);
  if (pP4 != (KeyInfo *)0x0) {
    sqlite3VdbeAppendP4(p,pP4,-9);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeSetP4KeyInfo(Parse *pParse, Index *pIdx){
  Vdbe *v = pParse->pVdbe;
  KeyInfo *pKeyInfo;
  assert( v!=0 );
  assert( pIdx!=0 );
  pKeyInfo = sqlite3KeyInfoOfIndex(pParse, pIdx);
  if( pKeyInfo ) sqlite3VdbeAppendP4(v, pKeyInfo, P4_KEYINFO);
}